

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::z_formatter::format(z_formatter *this,log_msg *msg,tm *tm_time,memory_buffer *dest)

{
  int iVar1;
  tm *in_RDX;
  undefined1 uVar2;
  bool is_negative;
  int total_minutes;
  scoped_pad p;
  size_t field_size;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  scoped_pad *in_stack_ffffffffffffffb0;
  
  scoped_pad::scoped_pad
            (in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
             ,(padding_info *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (memory_buffer *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(in_stack_ffffffffffffff9b,
                               CONCAT12(in_stack_ffffffffffffff9a,
                                        CONCAT11(in_stack_ffffffffffffff99,in_stack_ffffffffffffff98
                                                )))));
  iVar1 = os::utc_minutes_offset(in_RDX);
  uVar2 = iVar1 < 0;
  if ((bool)uVar2) {
    in_stack_ffffffffffffff9a = 0x2d;
    fmt::v5::internal::basic_buffer<char>::push_back
              ((basic_buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  }
  else {
    in_stack_ffffffffffffff99 = 0x2b;
    fmt::v5::internal::basic_buffer<char>::push_back
              ((basic_buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  }
  fmt_helper::pad2<500ul>
            (in_stack_ffffffffffffffa4,
             (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff9a,
                                              CONCAT11(in_stack_ffffffffffffff99,
                                                       in_stack_ffffffffffffff98)))));
  uVar3 = 0x3a;
  fmt::v5::internal::basic_buffer<char>::push_back
            ((basic_buffer<char> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  fmt_helper::pad2<500ul>
            (in_stack_ffffffffffffffa4,
             (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,
                      CONCAT13(uVar2,CONCAT12(in_stack_ffffffffffffff9a,
                                              CONCAT11(in_stack_ffffffffffffff99,uVar3)))));
  scoped_pad::~scoped_pad((scoped_pad *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 6;
        scoped_pad p(field_size, padinfo_, dest);

#ifdef _WIN32
        int total_minutes = get_cached_offset(msg, tm_time);
#else
        // No need to chache under gcc,
        // it is very fast (already stored in tm.tm_gmtoff)
        (void)(msg);
        int total_minutes = os::utc_minutes_offset(tm_time);
#endif
        bool is_negative = total_minutes < 0;
        if (is_negative)
        {
            total_minutes = -total_minutes;
            dest.push_back('-');
        }
        else
        {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest); // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest); // minutes
    }